

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void phosg::skip_whitespace_and_comments(StringReader *r,bool disable_extensions)

{
  bool bVar1;
  bool bVar2;
  int8_t iVar3;
  int8_t iVar4;
  size_t sVar5;
  char ch;
  bool reading_comment;
  bool disable_extensions_local;
  StringReader *r_local;
  
  bVar1 = false;
  do {
    bVar2 = StringReader::eof(r);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    iVar3 = StringReader::get_s8(r,false);
    if (bVar1) {
      if ((iVar3 == '\n') || (iVar3 == '\r')) {
        bVar1 = false;
      }
    }
    else {
      if ((!disable_extensions) && (iVar3 == '/')) {
        sVar5 = StringReader::where(r);
        iVar4 = StringReader::pget_s8(r,sVar5 + 1);
        if (iVar4 == '/') {
          bVar1 = true;
          goto LAB_0011f760;
        }
      }
      if ((((iVar3 != ' ') && (iVar3 != '\t')) && (iVar3 != '\r')) && (iVar3 != '\n')) {
        return;
      }
    }
LAB_0011f760:
    StringReader::get_s8(r,true);
  } while( true );
}

Assistant:

static void skip_whitespace_and_comments(StringReader& r, bool disable_extensions) {
  bool reading_comment = false;
  while (!r.eof()) {
    char ch = r.get_s8(false);
    if (reading_comment) {
      if ((ch == '\n') || (ch == '\r')) {
        reading_comment = false;
      }
    } else {
      if (!disable_extensions && (ch == '/') && (r.pget_s8(r.where() + 1) == '/')) {
        reading_comment = true;
      } else if ((ch != ' ') && (ch != '\t') && (ch != '\r') && (ch != '\n')) {
        return;
      }
    }
    r.get_s8();
  }
}